

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall
r_exec::Group::_initiate_sln_propagation
          (Group *this,Code *object,double change,double source_sln_thr,
          vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *path)

{
  pointer *pppCVar1;
  iterator __position;
  Code *pCVar2;
  char cVar3;
  int iVar4;
  Code **ppCVar5;
  undefined4 extraout_var;
  int64_t iVar6;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *__range2;
  uint uVar7;
  bool bVar8;
  double extraout_XMM0_Qa;
  ulong in_XMM0_Qb;
  Code *local_58;
  double local_50;
  double local_48;
  double local_38;
  ulong uStack_30;
  
  local_38 = ABS(change);
  uStack_30 = in_XMM0_Qb & 0x7fffffffffffffff;
  local_58 = object;
  local_50 = source_sln_thr;
  local_48 = change;
  (*(object->super__Object)._vptr__Object[0x15])(object);
  if (extraout_XMM0_Qa < local_38) {
    ppCVar5 = (path->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (path->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    bVar8 = ppCVar5 == __position._M_current;
    if (!bVar8) {
      pCVar2 = *ppCVar5;
      while (pCVar2 != local_58) {
        ppCVar5 = ppCVar5 + 1;
        bVar8 = ppCVar5 == __position._M_current;
        if (bVar8) goto LAB_0016fabc;
        pCVar2 = *ppCVar5;
      }
      if (!bVar8) {
        return;
      }
    }
LAB_0016fabc:
    if (__position._M_current ==
        (path->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<r_code::Code*,std::allocator<r_code::Code*>>::
      _M_realloc_insert<r_code::Code*const&>
                ((vector<r_code::Code*,std::allocator<r_code::Code*>> *)path,__position,&local_58);
    }
    else {
      *__position._M_current = local_58;
      pppCVar1 = &(path->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    (*(local_58->super__Object)._vptr__Object[4])(local_58,0);
    cVar3 = r_code::Atom::getDescriptor();
    if ((cVar3 == -0x3c) &&
       (iVar4 = (*(local_58->super__Object)._vptr__Object[10])(), (short)iVar4 != 0)) {
      uVar7 = 0;
      do {
        iVar4 = (*(local_58->super__Object)._vptr__Object[9])(local_58,(ulong)(uVar7 & 0xffff));
        _propagate_sln(this,(Code *)CONCAT44(extraout_var,iVar4),local_48,local_50,path);
        uVar7 = (uVar7 & 0xffff) + 1;
        iVar4 = (*(local_58->super__Object)._vptr__Object[10])();
      } while ((ushort)uVar7 < (ushort)iVar4);
    }
    (*(local_58->super__Object)._vptr__Object[0x13])();
    pCVar2 = local_58;
    for (iVar6 = (local_58->markers).used_cells_head; iVar6 != -1;
        iVar6 = (pCVar2->markers).cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar6].next) {
      _propagate_sln(this,(pCVar2->markers).cells.
                          super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar6].data,local_48,local_50,
                     path);
    }
    (*(local_58->super__Object)._vptr__Object[0x14])();
  }
  return;
}

Assistant:

void Group::_initiate_sln_propagation(Code *object, double change, double source_sln_thr, std::vector<Code *> &path) const
{
    if (fabs(change) > object->get_psln_thr()) {
        // prevent loops.
        for (Code  *node : path) {
            if (node == object) {
                return;
            }
        }

        path.push_back(object);

        if (object->code(0).getDescriptor() == Atom::MARKER) // if marker, propagate to references.
            for (uint16_t i = 0; i < object->references_size(); ++i) {
                _propagate_sln(object->get_reference(i), change, source_sln_thr, path);
            }

        // propagate to markers
        object->acq_markers();
        r_code::list<Code *>::const_iterator m;

        for (m = object->markers.begin(); m != object->markers.end(); ++m) {
            _propagate_sln(*m, change, source_sln_thr, path);
        }

        object->rel_markers();
    }
}